

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::DoubleNearPredFormat
          (char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,double abs_error)

{
  AssertionResult *pAVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_RDX;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  AssertionResult *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  ulong in_XMM1_Qb;
  double in_XMM2_Qa;
  AssertionResult AVar2;
  double diff;
  double epsilon;
  char *local_a0;
  char *local_98;
  undefined1 local_90 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  char *local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  ulong uStack_30;
  double local_28;
  
  local_78 = ABS(in_XMM0_Qa - in_XMM1_Qa);
  if (local_78 <= in_XMM2_Qa) {
    in_RDI->success_ = true;
    (in_RDI->message_)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    uStack_30 = in_XMM1_Qb & 0x7fffffffffffffff;
    local_38 = ABS(in_XMM1_Qa);
    if (ABS(in_XMM0_Qa) <= ABS(in_XMM1_Qa)) {
      local_38 = ABS(in_XMM0_Qa);
    }
    local_58 = in_XMM2_Qa;
    local_48 = in_XMM1_Qa;
    local_28 = in_XMM0_Qa;
    local_50 = nextafter(local_38,INFINITY);
    local_50 = local_50 - local_38;
    if ((((NAN(local_28)) || (NAN(local_48))) || (local_58 <= 0.0)) || (local_50 <= local_58)) {
      local_90[0] = false;
      local_88._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar1 = AssertionResult::operator<<
                         ((AssertionResult *)local_90,(char (*) [24])"The difference between ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])" and ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_a0);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])0x16b00b);
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [17])", which exceeds ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [9])", where\n");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_60);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x16baca);
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_a0);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [7])", and\n");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x16ba76);
      AssertionResult::AssertionResult(in_RDI,pAVar1);
      in_RDX = extraout_RDX_00.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
    }
    else {
      local_90[0] = false;
      local_88._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar1 = AssertionResult::operator<<
                         ((AssertionResult *)local_90,(char (*) [24])"The difference between ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])" and ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_a0);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])0x16b00b);
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [9])", where\n");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_98);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_60);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x16baca);
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_a0);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [27])".\nThe abs_error parameter ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
      pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
      pAVar1 = AssertionResult::operator<<
                         (pAVar1,(char (*) [100])
                                 " which is smaller than the minimum distance between doubles for numbers of this magnitude which is "
                         );
      pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
      pAVar1 = AssertionResult::operator<<
                         (pAVar1,(char (*) [106])
                                 ", thus making this EXPECT_NEAR check equivalent to EXPECT_EQUAL. Consider using EXPECT_DOUBLE_EQ instead."
                         );
      AssertionResult::AssertionResult(in_RDI,pAVar1);
      in_RDX._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
    if (local_88._M_head_impl !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88._M_head_impl);
      in_RDX._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )in_RDX._M_head_impl;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // Find the value which is closest to zero.
  const double min_abs = std::min(fabs(val1), fabs(val2));
  // Find the distance to the next double from that value.
  const double epsilon =
      nextafter(min_abs, std::numeric_limits<double>::infinity()) - min_abs;
  // Detect the case where abs_error is so small that EXPECT_NEAR is
  // effectively the same as EXPECT_EQUAL, and give an informative error
  // message so that the situation can be more easily understood without
  // requiring exotic floating-point knowledge.
  // Don't do an epsilon check if abs_error is zero because that implies
  // that an equality check was actually intended.
  if (!(std::isnan)(val1) && !(std::isnan)(val2) && abs_error > 0 &&
      abs_error < epsilon) {
    return AssertionFailure()
           << "The difference between " << expr1 << " and " << expr2 << " is "
           << diff << ", where\n"
           << expr1 << " evaluates to " << val1 << ",\n"
           << expr2 << " evaluates to " << val2 << ".\nThe abs_error parameter "
           << abs_error_expr << " evaluates to " << abs_error
           << " which is smaller than the minimum distance between doubles for "
              "numbers of this magnitude which is "
           << epsilon
           << ", thus making this EXPECT_NEAR check equivalent to "
              "EXPECT_EQUAL. Consider using EXPECT_DOUBLE_EQ instead.";
  }
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}